

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::ktx_texture::init_3D
          (ktx_texture *this,uint width,uint height,uint depth,uint num_mips,uint32 ogl_internal_fmt
          ,uint32 ogl_fmt,uint32 ogl_type)

{
  bool bVar1;
  uint32 ogl_internal_fmt_local;
  uint num_mips_local;
  uint depth_local;
  uint height_local;
  uint width_local;
  ktx_texture *this_local;
  
  clear(this);
  (this->m_header).m_pixelWidth = width;
  (this->m_header).m_pixelHeight = height;
  (this->m_header).m_pixelDepth = depth;
  (this->m_header).m_numberOfMipmapLevels = num_mips;
  (this->m_header).m_glInternalFormat = ogl_internal_fmt;
  (this->m_header).m_glFormat = ogl_fmt;
  (this->m_header).m_glType = ogl_type;
  (this->m_header).m_numberOfFaces = 1;
  bVar1 = compute_pixel_info(this);
  return bVar1;
}

Assistant:

bool ktx_texture::init_3D(uint width, uint height, uint depth, uint num_mips, uint32 ogl_internal_fmt, uint32 ogl_fmt, uint32 ogl_type)
    {
        clear();

        m_header.m_pixelWidth = width;
        m_header.m_pixelHeight = height;
        m_header.m_pixelDepth = depth;
        m_header.m_numberOfMipmapLevels = num_mips;
        m_header.m_glInternalFormat = ogl_internal_fmt;
        m_header.m_glFormat = ogl_fmt;
        m_header.m_glType = ogl_type;
        m_header.m_numberOfFaces = 1;

        if (!compute_pixel_info())
        {
            return false;
        }

        return true;
    }